

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteConstVector(BinaryWriterSpec *this,ConstVector *consts)

{
  pointer pCVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  Stream::Writef(this->json_stream_,"[");
  lVar5 = 0x28;
  uVar6 = 0;
  do {
    pCVar1 = (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar1;
    lVar3 = lVar2 % 0x38;
    if ((ulong)(lVar2 / 0x38) <= uVar6) {
      Stream::Writef(this->json_stream_,"]",lVar3);
      return;
    }
    Stream::Writef(this->json_stream_,"{",lVar3);
    WriteKey(this,"type");
    switch(*(undefined4 *)((long)pCVar1 + lVar5 + -8)) {
    case 0xfffffffc:
      pcVar4 = "f64";
      break;
    case 0xfffffffd:
      pcVar4 = "f32";
      goto LAB_00d90f03;
    case 0xfffffffe:
      pcVar4 = "i64";
      break;
    case 0xffffffff:
      pcVar4 = "i32";
LAB_00d90f03:
      WriteString(this,pcVar4);
      WriteSeparator(this);
      WriteKey(this,"value");
      Stream::Writef(this->json_stream_,"\"%u\"",
                     (ulong)*(uint *)((long)&(pCVar1->loc).filename.data_ + lVar5));
      goto LAB_00d90f36;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer-spec.cc"
                    ,0xcc,
                    "void wabt::(anonymous namespace)::BinaryWriterSpec::WriteConst(const Const &)")
      ;
    }
    WriteString(this,pcVar4);
    WriteSeparator(this);
    WriteKey(this,"value");
    Stream::Writef(this->json_stream_,"\"%lu\"",
                   *(undefined8 *)((long)&(pCVar1->loc).filename.data_ + lVar5));
LAB_00d90f36:
    Stream::Writef(this->json_stream_,"}");
    if (uVar6 != ((long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>).
                       _M_impl.super__Vector_impl_data._M_start) / 0x38 - 1U) {
      WriteSeparator(this);
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x38;
  } while( true );
}

Assistant:

void BinaryWriterSpec::WriteConstVector(const ConstVector& consts) {
  json_stream_->Writef("[");
  for (size_t i = 0; i < consts.size(); ++i) {
    const Const& const_ = consts[i];
    WriteConst(const_);
    if (i != consts.size() - 1) {
      WriteSeparator();
    }
  }
  json_stream_->Writef("]");
}